

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

Integer * copy_map(int *block,int block_ndim,int *map)

{
  uint uVar1;
  ulong uVar2;
  Integer *pIVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = 0;
  uVar8 = (ulong)(uint)block_ndim;
  if (block_ndim < 1) {
    uVar8 = uVar2;
  }
  iVar5 = 0;
  for (; uVar8 != uVar2; uVar2 = uVar2 + 1) {
    iVar5 = iVar5 + block[uVar2];
  }
  pIVar3 = (Integer *)malloc((long)iVar5 << 3);
  iVar4 = 0;
  for (uVar2 = 0; uVar2 != uVar8; uVar2 = uVar2 + 1) {
    uVar1 = block[uVar2];
    iVar5 = iVar5 - uVar1;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pIVar3[(long)iVar5 + uVar7] = (long)map[(long)iVar4 + uVar7] + 1;
    }
    iVar4 = iVar4 + uVar1;
  }
  return pIVar3;
}

Assistant:

static Integer* copy_map(int block[], int block_ndim, int map[])
{
    int d;
    int i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}